

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O1

uint32_t __thiscall
basisu::bitwise_coder::put_code(bitwise_coder *this,uint32_t sym,huffman_encoding_table *tab)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  char *__function;
  uint uVar4;
  ulong uVar5;
  
  if (sym < (tab->m_codes).m_size) {
    if (sym < (tab->m_code_sizes).m_size) {
      bVar1 = (tab->m_code_sizes).m_p[sym];
      if (bVar1 == 0) {
        __assert_fail("code_size >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                      ,0x94d,
                      "uint32_t basisu::bitwise_coder::put_code(uint32_t, const huffman_encoding_table &)"
                     );
      }
      if (0x20 < bVar1) {
        __assert_fail("num_bits <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                      ,0x933,"uint32_t basisu::bitwise_coder::put_bits(uint32_t, uint32_t)");
      }
      uVar2 = (tab->m_codes).m_p[sym];
      uVar4 = (uint)bVar1;
      if (uVar2 >> (bVar1 & 0x3f) != 0) {
        __assert_fail("bits < (1ULL << num_bits)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                      ,0x934,"uint32_t basisu::bitwise_coder::put_bits(uint32_t, uint32_t)");
      }
      this->m_total_bits = this->m_total_bits + (ulong)uVar4;
      uVar5 = (ulong)this->m_bit_buffer | (ulong)uVar2 << ((byte)this->m_bit_buffer_size & 0x3f);
      uVar3 = this->m_bit_buffer_size + uVar4;
      this->m_bit_buffer_size = uVar3;
      while (7 < uVar3) {
        append_byte(this,(uint8_t)uVar5);
        uVar5 = uVar5 >> 8;
        uVar3 = this->m_bit_buffer_size - 8;
        this->m_bit_buffer_size = uVar3;
      }
      this->m_bit_buffer = (uint)uVar5 & 0xff;
      return uVar4;
    }
    __function = 
    "const T &basisu::vector<unsigned char>::operator[](size_t) const [T = unsigned char]";
  }
  else {
    __function = 
    "const T &basisu::vector<unsigned short>::operator[](size_t) const [T = unsigned short]";
  }
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x177,__function);
}

Assistant:

inline vec operator/(const vec &lhs, T val) { vec res; for (uint32_t i = 0; i < N; i++) res.m_v[i] = lhs.m_v[i] / val; return res; }